

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O3

void fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(uint64_t *out1,uint64_t *arg1)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  
  uVar1 = *arg1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1 * 0x4e6a171024e6a171;
  uVar15 = SUB168(auVar2 * ZEXT816(0x6f),8);
  uVar12 = (ulong)CARRY8(SUB168(auVar2 * ZEXT816(0x6f),0),uVar1);
  uVar18 = uVar15 + arg1[1];
  uVar16 = uVar18 + uVar12;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar16 * 0x4e6a171024e6a171;
  uVar21 = (ulong)CARRY8(SUB168(auVar3 * ZEXT816(0x6f),0),uVar16) + SUB168(auVar3 * ZEXT816(0x6f),8)
           + (ulong)(CARRY8(uVar15,arg1[1]) || CARRY8(uVar18,uVar12));
  uVar12 = arg1[2];
  uVar10 = (uVar21 + uVar12) * 0x4e6a171024e6a171;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar10;
  uVar22 = (ulong)CARRY8(SUB168(auVar4 * ZEXT816(0x6f),0),uVar21 + uVar12) +
           SUB168(auVar4 * ZEXT816(0x6f),8) + (ulong)CARRY8(uVar21,uVar12);
  uVar18 = arg1[3];
  uVar23 = (uVar18 + uVar22) * 0x4e6a171024e6a171;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar23;
  uVar17 = (ulong)CARRY8(SUB168(auVar5 * ZEXT816(0x6f),0),uVar18 + uVar22) +
           SUB168(auVar5 * ZEXT816(0x6f),8) + (ulong)CARRY8(uVar22,uVar18);
  uVar15 = arg1[4];
  uVar25 = (uVar15 + uVar17) * 0x4e6a171024e6a171;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar25;
  uVar19 = (ulong)CARRY8(SUB168(auVar6 * ZEXT816(0x6f),0),uVar15 + uVar17) +
           SUB168(auVar6 * ZEXT816(0x6f),8) + (ulong)CARRY8(uVar17,uVar15);
  uVar14 = arg1[5];
  uVar11 = (uVar19 + uVar14) * 0x4e6a171024e6a171;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar11;
  uVar13 = (ulong)CARRY8(SUB168(auVar7 * ZEXT816(0x6f),0),uVar19 + uVar14) +
           SUB168(auVar7 * ZEXT816(0x6f),8) + (ulong)CARRY8(uVar19,uVar14);
  uVar20 = uVar16 << 0x3f | uVar1 * 0x4e6a171024e6a171 >> 1;
  uVar21 = uVar21 + uVar12 << 0x3f | uVar16 * 0x4e6a171024e6a171 >> 1;
  uVar22 = uVar22 + uVar18 << 0x3f | uVar10 >> 1;
  uVar16 = uVar17 + uVar15 << 0x3f | uVar23 >> 1;
  uVar19 = uVar19 + uVar14 << 0x3f | uVar25 >> 1;
  uVar14 = uVar13 + arg1[6];
  uVar12 = (ulong)CARRY8(uVar13,arg1[6]);
  uVar18 = (uVar1 << 0x3f) + arg1[7];
  uVar15 = uVar18 + uVar12;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar14 * 0x4e6a171024e6a171;
  uVar10 = SUB168(auVar8 * ZEXT816(0x6f),8);
  uVar11 = uVar11 >> 1 | uVar14 << 0x3f;
  uVar13 = uVar10 + uVar15;
  uVar18 = (ulong)(CARRY8(uVar1 << 0x3f,arg1[7]) || CARRY8(uVar18,uVar12)) +
           (ulong)CARRY8(uVar10,uVar15);
  uVar1 = (ulong)CARRY8(SUB168(auVar8 * ZEXT816(0x6f),0),uVar14);
  uVar17 = uVar13 + uVar1;
  uVar1 = (ulong)CARRY8(uVar13,uVar1);
  uVar12 = uVar18 + uVar20;
  uVar13 = uVar12 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar18,uVar20) || CARRY8(uVar12,uVar1));
  uVar20 = uVar21 + uVar1;
  uVar1 = (ulong)CARRY8(uVar21,uVar1);
  uVar21 = uVar22 + uVar1;
  uVar1 = (ulong)CARRY8(uVar22,uVar1);
  uVar10 = uVar16 + uVar1;
  uVar1 = (ulong)CARRY8(uVar16,uVar1);
  uVar16 = uVar19 + uVar1;
  uVar1 = (ulong)CARRY8(uVar19,uVar1);
  uVar18 = uVar11 + uVar1;
  uVar14 = (uVar14 * 0x4e6a171024e6a171 >> 1) + (ulong)CARRY8(uVar11,uVar1);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar17 * 0x4e6a171024e6a171;
  uVar15 = SUB168(auVar9 * ZEXT816(0x6f),8);
  uVar1 = (ulong)CARRY8(SUB168(auVar9 * ZEXT816(0x6f),0),uVar17);
  uVar12 = uVar15 + uVar13;
  uVar19 = uVar12 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar15,uVar13) || CARRY8(uVar12,uVar1));
  uVar23 = uVar20 + uVar1;
  uVar1 = (ulong)CARRY8(uVar20,uVar1);
  uVar25 = uVar21 + uVar1;
  uVar1 = (ulong)CARRY8(uVar21,uVar1);
  uVar20 = uVar10 + uVar1;
  uVar1 = (ulong)CARRY8(uVar10,uVar1);
  uVar21 = uVar16 + uVar1;
  uVar1 = (ulong)CARRY8(uVar16,uVar1);
  uVar22 = uVar18 + uVar1;
  uVar1 = (ulong)CARRY8(uVar18,uVar1);
  uVar12 = (uVar17 << 0x3f) + uVar14;
  uVar24 = uVar12 + uVar1;
  uVar16 = (uVar17 * 0x4e6a171024e6a171 >> 1) +
           (ulong)(CARRY8(uVar17 << 0x3f,uVar14) || CARRY8(uVar12,uVar1));
  uVar12 = (ulong)(byte)-((0x6e < uVar19) + -1);
  uVar18 = (ulong)(uVar23 < uVar12);
  uVar15 = (ulong)(uVar25 < uVar18);
  uVar14 = (ulong)(uVar20 < uVar15);
  uVar10 = (ulong)(uVar21 < uVar14);
  uVar11 = (ulong)(uVar22 < uVar10);
  uVar13 = (ulong)(uVar24 < uVar11) | 0x8000000000000000;
  uVar1 = -(ulong)(uVar16 < uVar13);
  uVar17 = ~uVar1;
  *out1 = uVar19 - 0x6f & uVar17 | uVar19 & uVar1;
  out1[1] = uVar23 - uVar12 & uVar17 | uVar23 & uVar1;
  out1[2] = uVar25 - uVar18 & uVar17 | uVar25 & uVar1;
  out1[3] = uVar20 - uVar15 & uVar17 | uVar20 & uVar1;
  out1[4] = uVar21 - uVar14 & uVar17 | uVar21 & uVar1;
  out1[5] = uVar22 - uVar10 & uVar17 | uVar22 & uVar1;
  out1[6] = uVar24 - uVar11 & uVar17 | uVar24 & uVar1;
  out1[7] = uVar17 & uVar16 - uVar13 | uVar1 & uVar16;
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(
    uint64_t out1[8], const uint64_t arg1[8]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x9;
    uint64_t x10;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x11;
    uint64_t x12;
    uint64_t x13;
    uint64_t x14;
    uint64_t x15;
    uint64_t x16;
    uint64_t x17;
    uint64_t x18;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x19;
    uint64_t x20;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x21;
    uint64_t x22;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x23;
    uint64_t x24;
    uint64_t x25;
    uint64_t x26;
    uint64_t x27;
    uint64_t x28;
    uint64_t x29;
    uint64_t x30;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x31;
    uint64_t x32;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x33;
    uint64_t x34;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x35;
    uint64_t x36;
    uint64_t x37;
    uint64_t x38;
    uint64_t x39;
    uint64_t x40;
    uint64_t x41;
    uint64_t x42;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x43;
    uint64_t x44;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x45;
    uint64_t x46;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x47;
    uint64_t x48;
    uint64_t x49;
    uint64_t x50;
    uint64_t x51;
    uint64_t x52;
    uint64_t x53;
    uint64_t x54;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x55;
    uint64_t x56;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x57;
    uint64_t x58;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x59;
    uint64_t x60;
    uint64_t x61;
    uint64_t x62;
    uint64_t x63;
    uint64_t x64;
    uint64_t x65;
    uint64_t x66;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x67;
    uint64_t x68;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x69;
    uint64_t x70;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x71;
    uint64_t x72;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x73;
    uint64_t x74;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x75;
    uint64_t x76;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x77;
    uint64_t x78;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x79;
    uint64_t x80;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x81;
    uint64_t x82;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x83;
    uint64_t x84;
    uint64_t x85;
    uint64_t x86;
    uint64_t x87;
    uint64_t x88;
    uint64_t x89;
    uint64_t x90;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x91;
    uint64_t x92;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x93;
    uint64_t x94;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x95;
    uint64_t x96;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x97;
    uint64_t x98;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x99;
    uint64_t x100;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x101;
    uint64_t x102;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x103;
    uint64_t x104;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x105;
    uint64_t x106;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x107;
    uint64_t x108;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x109;
    uint64_t x110;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x111;
    uint64_t x112;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x113;
    uint64_t x114;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x115;
    uint64_t x116;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x117;
    uint64_t x118;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x119;
    uint64_t x120;
    uint64_t x121;
    uint64_t x122;
    uint64_t x123;
    uint64_t x124;
    uint64_t x125;
    uint64_t x126;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x127;
    uint64_t x128;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x129;
    uint64_t x130;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x131;
    uint64_t x132;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x133;
    uint64_t x134;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x135;
    uint64_t x136;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x137;
    uint64_t x138;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x139;
    uint64_t x140;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x141;
    uint64_t x142;
    uint64_t x143;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x144;
    uint64_t x145;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x146;
    uint64_t x147;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x148;
    uint64_t x149;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x150;
    uint64_t x151;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x152;
    uint64_t x153;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x154;
    uint64_t x155;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x156;
    uint64_t x157;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x158;
    uint64_t x159;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_uint1 x160;
    uint64_t x161;
    uint64_t x162;
    uint64_t x163;
    uint64_t x164;
    uint64_t x165;
    uint64_t x166;
    uint64_t x167;
    uint64_t x168;
    x1 = (arg1[0]);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x2, &x3, x1, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x4, &x5, x2, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x6, &x7, x2,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x8, &x9, 0x0, x1,
                                                            x6);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x10, &x11, 0x0, (x9 + x7), (arg1[1]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x12, &x13, x10, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x14, &x15, x12, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x16, &x17, x12,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x18, &x19, 0x0, x5,
                                                            x14);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x20, &x21, 0x0,
                                                            x10, x16);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x22, &x23, 0x0, (((uint64_t)x21 + x11) + x17), (arg1[2]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x24, &x25, x22, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x26, &x27, x24, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x28, &x29, x24,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x30, &x31, 0x0,
                                                            (x19 + x15), x26);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x32, &x33, 0x0,
                                                            x22, x28);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x34, &x35, 0x0, (((uint64_t)x33 + x23) + x29), (arg1[3]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x36, &x37, x34, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x38, &x39, x36, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x40, &x41, x36,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x42, &x43, 0x0,
                                                            (x31 + x27), x38);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x44, &x45, 0x0,
                                                            x34, x40);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x46, &x47, 0x0, (((uint64_t)x45 + x35) + x41), (arg1[4]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x48, &x49, x46, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x50, &x51, x48, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x52, &x53, x48,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x54, &x55, 0x0,
                                                            (x43 + x39), x50);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x56, &x57, 0x0,
                                                            x46, x52);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x58, &x59, 0x0, (((uint64_t)x57 + x47) + x53), (arg1[5]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x60, &x61, x58, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x62, &x63, x60, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x64, &x65, x60,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x66, &x67, 0x0,
                                                            (x55 + x51), x62);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x68, &x69, 0x0,
                                                            x58, x64);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x70, &x71, 0x0, (((uint64_t)x69 + x59) + x65), (arg1[6]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x72, &x73, x71, x4,
                                                            0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x74, &x75, x73,
                                                            x18, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x76, &x77, x75,
                                                            x30, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x78, &x79, x77,
                                                            x42, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x80, &x81, x79,
                                                            x54, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x82, &x83, x81,
                                                            x66, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x84, &x85, x70, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x86, &x87, x84, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x88, &x89, x84,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x90, &x91, 0x0,
                                                            x70, x88);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x92, &x93, x91,
                                                            x72, x89);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x94, &x95, x93,
                                                            x74, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x96, &x97, x95,
                                                            x76, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x98, &x99, x97,
                                                            x78, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x100, &x101, x99,
                                                            x80, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x102, &x103, x101,
                                                            x82, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x104, &x105, x103, (x83 + (x67 + x63)), x86);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x106, &x107, 0x0,
                                                            x92, (arg1[7]));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x108, &x109, x107,
                                                            x94, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x110, &x111, x109,
                                                            x96, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x112, &x113, x111,
                                                            x98, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x114, &x115, x113,
                                                            x100, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x116, &x117, x115,
                                                            x102, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x118, &x119, x117,
                                                            x104, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x120, &x121, x106, UINT64_C(0x4e6a171024e6a171));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(
        &x122, &x123, x120, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mulx_u64(&x124, &x125, x120,
                                                       UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x126, &x127, 0x0,
                                                            x106, x124);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x128, &x129, x127,
                                                            x108, x125);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x130, &x131, x129,
                                                            x110, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x132, &x133, x131,
                                                            x112, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x134, &x135, x133,
                                                            x114, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x136, &x137, x135,
                                                            x116, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(&x138, &x139, x137,
                                                            x118, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_addcarryx_u64(
        &x140, &x141, x139, (x119 + (x105 + x87)), x122);
    x142 = (x141 + x123);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(
        &x143, &x144, 0x0, x128, UINT8_C(0x6f));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x145, &x146, x144,
                                                             x130, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x147, &x148, x146,
                                                             x132, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x149, &x150, x148,
                                                             x134, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x151, &x152, x150,
                                                             x136, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x153, &x154, x152,
                                                             x138, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x155, &x156, x154,
                                                             x140, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(
        &x157, &x158, x156, x142, UINT64_C(0x8000000000000000));
    fiat_id_tc26_gost_3410_2012_512_paramSetB_subborrowx_u64(&x159, &x160, x158,
                                                             0x0, 0x0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x161, x160, x143,
                                                          x128);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x162, x160, x145,
                                                          x130);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x163, x160, x147,
                                                          x132);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x164, x160, x149,
                                                          x134);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x165, x160, x151,
                                                          x136);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x166, x160, x153,
                                                          x138);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x167, x160, x155,
                                                          x140);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_cmovznz_u64(&x168, x160, x157,
                                                          x142);
    out1[0] = x161;
    out1[1] = x162;
    out1[2] = x163;
    out1[3] = x164;
    out1[4] = x165;
    out1[5] = x166;
    out1[6] = x167;
    out1[7] = x168;
}